

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
 __thiscall
spvtools::opt::analysis::ConstantManager::CreateConstant
          (ConstantManager *this,Type *type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literal_words_or_ids)

{
  uint *args_1;
  spv_opcode_desc_t *psVar1;
  pointer ppCVar2;
  bool bVar3;
  IRContext *pIVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  long lVar5;
  long lVar6;
  spvtools *this_00;
  IRContext *pIVar7;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  components;
  Array *at;
  Struct *st;
  Matrix *mt;
  Vector *vt;
  Float *ft;
  Integer *it;
  Bool *bt;
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_90;
  Array *local_78;
  Struct *local_70;
  Matrix *local_68;
  Vector *local_60;
  Float *local_58;
  Integer *local_50;
  Bool *local_48;
  Type *local_40;
  spvtools local_38 [8];
  
  local_40 = (Type *)literal_words_or_ids;
  if ((in_RCX->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (in_RCX->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    MakeUnique<spvtools::opt::analysis::NullConstant,spvtools::opt::analysis::Type_const*&>
              ((spvtools *)&local_90,&local_40);
LAB_001c433d:
    this->ctx_ = (IRContext *)local_90._M_impl.super__Vector_impl_data._M_start;
    return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
              )this;
  }
  local_48 = (Bool *)(**(code **)((literal_words_or_ids->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start + 0x10))
                               (literal_words_or_ids);
  if (local_48 != (Bool *)0x0) {
    args_1 = (in_RCX->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(in_RCX->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)args_1 != 4) {
      __assert_fail("literal_words_or_ids.size() == 1 && \"Bool constant should be declared with one operand\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                    ,0xf9,
                    "std::unique_ptr<Constant> spvtools::opt::analysis::ConstantManager::CreateConstant(const Type *, const std::vector<uint32_t> &) const"
                   );
    }
    MakeUnique<spvtools::opt::analysis::BoolConstant,spvtools::opt::analysis::Bool_const*&,unsigned_int_const&>
              ((spvtools *)&local_90,&local_48,args_1);
    goto LAB_001c433d;
  }
  local_50 = (Integer *)
             (**(code **)((literal_words_or_ids->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start + 0x14))(literal_words_or_ids);
  if (local_50 != (Integer *)0x0) {
    MakeUnique<spvtools::opt::analysis::IntConstant,spvtools::opt::analysis::Integer_const*&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
              ((spvtools *)&local_90,&local_50,in_RCX);
    goto LAB_001c433d;
  }
  local_58 = (Float *)(**(code **)((literal_words_or_ids->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start + 0x18))
                                (literal_words_or_ids);
  if (local_58 != (Float *)0x0) {
    MakeUnique<spvtools::opt::analysis::FloatConstant,spvtools::opt::analysis::Float_const*&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
              ((spvtools *)&local_90,&local_58,in_RCX);
    goto LAB_001c433d;
  }
  local_60 = (Vector *)
             (**(code **)((literal_words_or_ids->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start + 0x1c))(literal_words_or_ids);
  if (local_60 == (Vector *)0x0) {
    local_68 = (Matrix *)
               (**(code **)((literal_words_or_ids->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start + 0x20))(literal_words_or_ids);
    if (local_68 != (Matrix *)0x0) {
      GetConstantsFromIds((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                           *)&local_90,(ConstantManager *)type,in_RCX);
      if (local_90._M_impl.super__Vector_impl_data._M_start ==
          local_90._M_impl.super__Vector_impl_data._M_finish) goto LAB_001c45b9;
      this_00 = (spvtools *)&local_70;
      MakeUnique<spvtools::opt::analysis::MatrixConstant,spvtools::opt::analysis::Matrix_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                (this_00,&local_68,
                 (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  *)&local_90);
      goto LAB_001c462c;
    }
    local_70 = (Struct *)
               (**(code **)((literal_words_or_ids->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start + 0x38))(literal_words_or_ids);
    if (local_70 == (Struct *)0x0) {
      local_78 = (Array *)(**(code **)((literal_words_or_ids->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 0x30))
                                    (literal_words_or_ids);
      if (local_78 == (Array *)0x0) {
        this->ctx_ = (IRContext *)0x0;
        return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
                )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
                  )this;
      }
      GetConstantsFromIds((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                           *)&local_90,(ConstantManager *)type,in_RCX);
      if (local_90._M_impl.super__Vector_impl_data._M_start ==
          local_90._M_impl.super__Vector_impl_data._M_finish) goto LAB_001c45b9;
      this_00 = local_38;
      MakeUnique<spvtools::opt::analysis::ArrayConstant,spvtools::opt::analysis::Array_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                (this_00,&local_78,
                 (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  *)&local_90);
      goto LAB_001c462c;
    }
    GetConstantsFromIds((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                         *)&local_90,(ConstantManager *)type,in_RCX);
    if (local_90._M_impl.super__Vector_impl_data._M_start !=
        local_90._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (spvtools *)&local_78;
      MakeUnique<spvtools::opt::analysis::StructConstant,spvtools::opt::analysis::Struct_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                (this_00,&local_70,
                 (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  *)&local_90);
      goto LAB_001c462c;
    }
LAB_001c45b9:
    pIVar4 = (IRContext *)0x0;
  }
  else {
    GetConstantsFromIds((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                         *)&local_90,(ConstantManager *)type,in_RCX);
    ppCVar2 = local_90._M_impl.super__Vector_impl_data._M_finish;
    if (local_90._M_impl.super__Vector_impl_data._M_start ==
        local_90._M_impl.super__Vector_impl_data._M_finish) {
LAB_001c460f:
      this->ctx_ = (IRContext *)0x0;
      goto LAB_001c4632;
    }
    lVar6 = (long)local_90._M_impl.super__Vector_impl_data._M_finish -
            (long)local_90._M_impl.super__Vector_impl_data._M_start;
    pIVar4 = (IRContext *)local_90._M_impl.super__Vector_impl_data._M_start;
    for (lVar5 = lVar6 >> 5; pIVar7 = pIVar4, 0 < lVar5; lVar5 = lVar5 + -1) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::$_0>
              ::operator()((_Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::__0>
                            *)pIVar4,
                           (__normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                            )type);
      if (bVar3) goto LAB_001c44f3;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::$_0>
              ::operator()((_Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::__0>
                            *)&pIVar4->grammar_,
                           (__normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                            )type);
      pIVar7 = (IRContext *)&pIVar4->grammar_;
      if (bVar3) goto LAB_001c44f3;
      pIVar7 = (IRContext *)&(pIVar4->grammar_).operandTable_;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::$_0>
              ::operator()((_Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::__0>
                            *)pIVar7,
                           (__normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                            )type);
      if (bVar3) goto LAB_001c44f3;
      pIVar7 = (IRContext *)&(pIVar4->grammar_).opcodeTable_;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::$_0>
              ::operator()((_Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::__0>
                            *)pIVar7,
                           (__normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                            )type);
      if (bVar3) goto LAB_001c44f3;
      pIVar4 = (IRContext *)&(pIVar4->grammar_).extInstTable_;
      lVar6 = lVar6 + -0x20;
    }
    lVar6 = lVar6 >> 3;
    if (lVar6 == 1) {
LAB_001c44e2:
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::$_0>
              ::operator()((_Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::__0>
                            *)pIVar4,
                           (__normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                            )type);
      pIVar7 = pIVar4;
      if (!bVar3) {
        pIVar7 = (IRContext *)ppCVar2;
      }
LAB_001c44f3:
      if (pIVar7 != (IRContext *)ppCVar2) goto LAB_001c460f;
    }
    else {
      if (lVar6 == 2) {
LAB_001c44d2:
        bVar3 = __gnu_cxx::__ops::
                _Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::$_0>
                ::operator()((_Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::__0>
                              *)pIVar4,
                             (__normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                              )type);
        pIVar7 = pIVar4;
        if (!bVar3) {
          pIVar4 = (IRContext *)&pIVar4->grammar_;
          goto LAB_001c44e2;
        }
        goto LAB_001c44f3;
      }
      if (lVar6 == 3) {
        bVar3 = __gnu_cxx::__ops::
                _Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::$_0>
                ::operator()((_Iter_negate<spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::__0>
                              *)pIVar4,
                             (__normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                              )type);
        if (!bVar3) {
          pIVar4 = (IRContext *)&pIVar4->grammar_;
          goto LAB_001c44d2;
        }
        goto LAB_001c44f3;
      }
    }
    psVar1 = (spv_opcode_desc_t *)
             (*(spv_context *)local_90._M_impl.super__Vector_impl_data._M_start)->opcode_table;
    lVar5 = (long)local_90._M_impl.super__Vector_impl_data._M_finish -
            (long)local_90._M_impl.super__Vector_impl_data._M_start;
    for (lVar6 = lVar5 >> 5; 0 < lVar6; lVar6 = lVar6 + -1) {
      if ((spv_opcode_desc_t *)
          ((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->syntax_context_->
          opcode_table != psVar1) goto LAB_001c460a;
      if (*(spv_opcode_desc_t **)
           (*(long *)&((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->grammar_ + 8
           ) != psVar1) {
        local_90._M_impl.super__Vector_impl_data._M_start =
             (pointer)&((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->grammar_;
        goto LAB_001c460a;
      }
      if ((spv_opcode_desc_t *)
          ((((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->grammar_).
          operandTable_)->types != psVar1) {
        local_90._M_impl.super__Vector_impl_data._M_start =
             (pointer)&(((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->grammar_).
                       operandTable_;
        goto LAB_001c460a;
      }
      if (((((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->grammar_).opcodeTable_
          )->entries != psVar1) {
        local_90._M_impl.super__Vector_impl_data._M_start =
             (pointer)&(((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->grammar_).
                       opcodeTable_;
        goto LAB_001c460a;
      }
      local_90._M_impl.super__Vector_impl_data._M_start =
           (pointer)&(((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->grammar_).
                     extInstTable_;
      lVar5 = lVar5 + -0x20;
    }
    lVar5 = lVar5 >> 3;
    if (lVar5 == 1) {
LAB_001c45ed:
      if ((spv_opcode_desc_t *)
          ((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->syntax_context_->
          opcode_table == psVar1) {
        local_90._M_impl.super__Vector_impl_data._M_start =
             local_90._M_impl.super__Vector_impl_data._M_finish;
      }
LAB_001c460a:
      if (local_90._M_impl.super__Vector_impl_data._M_start !=
          local_90._M_impl.super__Vector_impl_data._M_finish) goto LAB_001c460f;
    }
    else {
      if (lVar5 == 2) {
LAB_001c45e0:
        if ((spv_opcode_desc_t *)
            ((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->syntax_context_->
            opcode_table == psVar1) {
          local_90._M_impl.super__Vector_impl_data._M_start =
               (pointer)&((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->grammar_;
          goto LAB_001c45ed;
        }
        goto LAB_001c460a;
      }
      if (lVar5 == 3) {
        if ((spv_opcode_desc_t *)
            ((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->syntax_context_->
            opcode_table == psVar1) {
          local_90._M_impl.super__Vector_impl_data._M_start =
               (pointer)&((IRContext *)local_90._M_impl.super__Vector_impl_data._M_start)->grammar_;
          goto LAB_001c45e0;
        }
        goto LAB_001c460a;
      }
    }
    this_00 = (spvtools *)&local_68;
    MakeUnique<spvtools::opt::analysis::VectorConstant,spvtools::opt::analysis::Vector_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
              (this_00,&local_60,
               (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                *)&local_90);
LAB_001c462c:
    pIVar4 = *(IRContext **)this_00;
  }
  this->ctx_ = pIVar4;
LAB_001c4632:
  std::
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::~_Vector_base(&local_90);
  return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Constant> ConstantManager::CreateConstant(
    const Type* type, const std::vector<uint32_t>& literal_words_or_ids) const {
  if (literal_words_or_ids.size() == 0) {
    // Constant declared with OpConstantNull
    return MakeUnique<NullConstant>(type);
  } else if (auto* bt = type->AsBool()) {
    assert(literal_words_or_ids.size() == 1 &&
           "Bool constant should be declared with one operand");
    return MakeUnique<BoolConstant>(bt, literal_words_or_ids.front());
  } else if (auto* it = type->AsInteger()) {
    return MakeUnique<IntConstant>(it, literal_words_or_ids);
  } else if (auto* ft = type->AsFloat()) {
    return MakeUnique<FloatConstant>(ft, literal_words_or_ids);
  } else if (auto* vt = type->AsVector()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    // All components of VectorConstant must be of type Bool, Integer or Float.
    if (!std::all_of(components.begin(), components.end(),
                     [](const Constant* c) {
                       if (c->type()->AsBool() || c->type()->AsInteger() ||
                           c->type()->AsFloat()) {
                         return true;
                       } else {
                         return false;
                       }
                     }))
      return nullptr;
    // All components of VectorConstant must be in the same type.
    const auto* component_type = components.front()->type();
    if (!std::all_of(components.begin(), components.end(),
                     [&component_type](const Constant* c) {
                       if (c->type() == component_type) return true;
                       return false;
                     }))
      return nullptr;
    return MakeUnique<VectorConstant>(vt, components);
  } else if (auto* mt = type->AsMatrix()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    return MakeUnique<MatrixConstant>(mt, components);
  } else if (auto* st = type->AsStruct()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    return MakeUnique<StructConstant>(st, components);
  } else if (auto* at = type->AsArray()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    return MakeUnique<ArrayConstant>(at, components);
  } else {
    return nullptr;
  }
}